

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_smooth_predictor_8x4_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  __m128i ww [2];
  __m128i wh [4];
  __m128i pixels [4];
  
  load_pixel_w8(above,left,4,pixels);
  wh[0][0] = 0x400055009500ff;
  wh[0][1] = 0x69009200c500ff;
  wh[1][0] = 0xc000ab006b0001;
  wh[1][1] = 0x97006e003b0001;
  ww[0][0] = 0x3b00c5000100ff;
  ww[0][1] = 0x970069006e0092;
  ww[1][0] = 0xce003200b70049;
  ww[1][1] = 0xe0002000db0025;
  smooth_pred_8xh(pixels,wh,ww,4,dst,stride,0);
  return;
}

Assistant:

void aom_smooth_predictor_8x4_ssse3(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, const uint8_t *left) {
  __m128i pixels[4];
  load_pixel_w8(above, left, 4, pixels);

  __m128i wh[4], ww[2];
  load_weight_w8(4, wh, ww);

  smooth_pred_8xh(pixels, wh, ww, 4, dst, stride, 0);
}